

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

InputIterator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_12UL,_void>
__thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
::getDataIterator(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                  *this)

{
  unsigned_long extraout_RDX;
  _Head_base<0UL,_supermap::io::InputStream_*,_false> in_RDI;
  InputIterator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_12UL,_void>
  IVar1;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  *this_00;
  format fVar2;
  string_type *in_stack_ffffffffffffff88;
  path *in_stack_ffffffffffffff90;
  FileManager *in_stack_ffffffffffffff98;
  
  this_00 = (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
             *)&stack0xffffffffffffffe0;
  getFileManager(this_00);
  std::__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x2073bc);
  fVar2 = (format)((ulong)&stack0xffffffffffffff98 >> 0x38);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_(this_00);
  std::filesystem::__cxx11::path::path(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,fVar2);
  io::FileManager::
  getInputIterator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(uint64_t)in_stack_ffffffffffffff88
            );
  std::filesystem::__cxx11::path::~path((path *)in_RDI._M_head_impl);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x207425);
  IVar1.index_ = extraout_RDX;
  IVar1.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
          )in_RDI._M_head_impl;
  return IVar1;
}

Assistant:

io::InputIterator<T, IndexT> getDataIterator() const {
        return getFileManager()->template getInputIterator<T, IndexT>(getStorageFilePath(), 0);
    }